

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

void liveness_pass_1(TCGContext_conflict9 *s)

{
  byte *pbVar1;
  uint ng;
  uint nt;
  TCGOp *pTVar2;
  TCGOpDef *pTVar3;
  TCGRegSet *pTVar4;
  ulong uVar5;
  uint *puVar6;
  TCGArg TVar7;
  undefined1 auVar8 [16];
  byte bVar9;
  uint uVar10;
  uint8_t *puVar11;
  long lVar12;
  void **ppvVar13;
  ulong uVar14;
  long lVar15;
  TCGArg TVar16;
  ulong uVar17;
  uint uVar18;
  TCGRegSet TVar19;
  uint uVar20;
  uint uVar21;
  TCGOp *op;
  uint uVar22;
  undefined2 uVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  byte local_81;
  uint local_54;
  
  ng = s->nb_globals;
  nt = s->nb_temps;
  uVar10 = nt * 4 + 7;
  uVar18 = nt * 4 + 0xe;
  if (-1 < (int)uVar10) {
    uVar18 = uVar10;
  }
  puVar11 = s->pool_cur;
  if (s->pool_end < puVar11 + (int)(uVar18 & 0xfffffff8)) {
    puVar11 = (uint8_t *)tcg_malloc_internal_tricore(s,uVar18 & 0xfffffff8);
  }
  else {
    s->pool_cur = puVar11 + (int)(uVar18 & 0xfffffff8);
  }
  auVar8 = _DAT_00d58680;
  if (0 < (int)nt) {
    lVar15 = (ulong)nt - 1;
    auVar25._8_4_ = (int)lVar15;
    auVar25._0_8_ = lVar15;
    auVar25._12_4_ = (int)((ulong)lVar15 >> 0x20);
    lVar15 = 0;
    auVar25 = auVar25 ^ _DAT_00d58680;
    auVar26 = _DAT_00d58670;
    do {
      auVar27 = auVar26 ^ auVar8;
      if ((bool)(~(auVar27._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar27._0_4_ ||
                  auVar25._4_4_ < auVar27._4_4_) & 1)) {
        *(uint8_t **)((long)&s->temps[0].state_ptr + lVar15) = puVar11;
      }
      if ((auVar27._12_4_ != auVar25._12_4_ || auVar27._8_4_ <= auVar25._8_4_) &&
          auVar27._12_4_ <= auVar25._12_4_) {
        *(uint8_t **)((long)&s->temps[1].state_ptr + lVar15) = puVar11 + 4;
      }
      lVar12 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 2;
      auVar26._8_8_ = lVar12 + 2;
      lVar15 = lVar15 + 0x70;
      puVar11 = puVar11 + 8;
    } while ((ulong)(nt + 1 >> 1) * 0x70 - lVar15 != 0);
  }
  la_func_end(s,ng,nt);
  op = (TCGOp *)((s->ops).tqh_circ.tql_prev)->tql_prev->tql_next;
  if (op != (TCGOp *)0x0) {
    lVar15 = (ulong)ng * 0x38;
    do {
      pTVar2 = (TCGOp *)((op->link).tqe_circ.tql_prev)->tql_prev->tql_next;
      uVar18 = *(uint *)op;
      uVar10 = uVar18 & 0xff;
      uVar22 = uVar10 << 5;
      pTVar3 = s->tcg_op_defs;
      if (uVar10 < 0x7b) {
        if (0x27 < uVar10) {
          uVar24 = 0x13;
          if (uVar10 - 0x29 < 2) goto LAB_00d03c2f;
          if (uVar10 == 0x28) {
            uVar24 = 0x12;
            goto LAB_00d03c6d;
          }
switchD_00d03c14_caseD_7f:
          bVar9 = (&pTVar3->nb_oargs)[uVar22];
          local_81 = (&pTVar3->nb_iargs)[uVar22];
          if (bVar9 == 0 || ((&pTVar3->flags)[uVar22] & 8) != 0) {
LAB_00d04087:
            local_54 = (uint)local_81;
            if (bVar9 != 0) goto LAB_00d03cde;
            uVar18 = 0;
            uVar17 = 0;
            uVar24 = 0;
            goto LAB_00d03d36;
          }
          uVar17 = 0;
          do {
            if (*(long *)(op->args[uVar17] + 0x28) != 1) goto LAB_00d04087;
            uVar17 = uVar17 + 1;
          } while (bVar9 != uVar17);
          goto LAB_00d03c8a;
        }
        if (uVar10 == 0) {
          TVar16 = op->args[0];
          *(undefined8 *)(TVar16 + 0x28) = 1;
          **(undefined4 **)(TVar16 + 0x30) = 0;
          goto switchD_00d03c14_caseD_81;
        }
        if (uVar10 != 2) {
          uVar24 = 0x11;
          if (uVar10 == 0x27) goto LAB_00d03c6d;
          goto switchD_00d03c14_caseD_7f;
        }
        uVar10 = uVar18 >> 0xc & 0xf;
        uVar17 = (ulong)uVar10;
        uVar18 = uVar18 >> 8 & 0xf;
        TVar16 = op->args[(ulong)(uVar10 + uVar18) + 1];
        if ((TVar16 & 4) != 0) {
          if (uVar10 != 0) {
            uVar14 = 0;
            do {
              if (*(long *)(op->args[uVar14] + 0x28) != 1) goto LAB_00d03efb;
              uVar14 = uVar14 + 1;
            } while (uVar17 != uVar14);
          }
          goto LAB_00d03c8a;
        }
LAB_00d03efb:
        if (uVar10 == 0) {
          uVar22 = 0;
        }
        else {
          uVar14 = 0;
          uVar22 = 0;
          do {
            TVar7 = op->args[uVar14];
            uVar24 = 0;
            if ((*(ulong *)(TVar7 + 0x28) & 1) != 0) {
              uVar24 = 4 << ((byte)uVar14 & 0x1f);
            }
            uVar20 = 0;
            if ((*(ulong *)(TVar7 + 0x28) & 2) != 0) {
              uVar20 = 1 << ((byte)uVar14 & 0x1f);
            }
            uVar22 = uVar22 | uVar20 | uVar24;
            *(undefined8 *)(TVar7 + 0x28) = 1;
            **(undefined4 **)(TVar7 + 0x30) = 0;
            op->output_pref[uVar14] = 0;
            uVar14 = uVar14 + 1;
          } while (uVar17 != uVar14);
        }
        uVar23 = (undefined2)uVar22;
        if ((TVar16 & 3) == 0) {
          if (0 < (int)ng) {
            lVar12 = 0;
            do {
              *(undefined8 *)((long)&s->temps[0].state + lVar12) = 3;
              **(TCGRegSet **)((long)&s->temps[0].state_ptr + lVar12) =
                   s->tcg_target_available_regs[(byte)(&s->temps[0].field_0x3)[lVar12]];
              lVar12 = lVar12 + 0x38;
            } while (lVar15 != lVar12);
          }
        }
        else if ((TVar16 & 1) == 0) {
          la_global_sync(s,ng);
        }
        uVar14 = uVar17;
        if (uVar18 == 0) {
          la_cross_call(s,nt);
        }
        else {
          do {
            if ((op->args[uVar14] != 0) && ((*(byte *)(op->args[uVar14] + 0x28) & 1) != 0)) {
              uVar22 = uVar22 | 4 << ((byte)uVar14 & 0x1f);
            }
            uVar23 = (undefined2)uVar22;
            uVar14 = uVar14 + 1;
          } while (uVar14 < uVar10 + uVar18);
          la_cross_call(s,nt);
          if (uVar18 != 0) {
            uVar14 = 0;
            do {
              TVar16 = op->args[uVar17 + uVar14];
              if ((TVar16 != 0) && (uVar5 = *(ulong *)(TVar16 + 0x28), (uVar5 & 1) != 0)) {
                TVar19 = 0;
                if (5 < uVar14) {
                  TVar19 = s->tcg_target_available_regs[*(byte *)(TVar16 + 3)];
                }
                **(TCGRegSet **)(TVar16 + 0x30) = TVar19;
                *(ulong *)(TVar16 + 0x28) = uVar5 & 0xfffffffffffffffe;
              }
              uVar14 = uVar14 + 1;
            } while (uVar18 != uVar14);
            if (uVar18 != 0) {
              if (5 < uVar18) {
                uVar18 = 6;
              }
              uVar14 = 0;
              do {
                lVar12 = *(long *)((long)op->args + uVar14 * 2 + uVar17 * 8);
                if (lVar12 != 0) {
                  puVar6 = *(uint **)(lVar12 + 0x30);
                  *puVar6 = *puVar6 | 1 << (*(byte *)((long)tcg_target_call_iarg_regs + uVar14) &
                                           0x1f);
                }
                uVar14 = uVar14 + 4;
              } while (uVar18 << 2 != uVar14);
            }
          }
        }
      }
      else {
        switch(uVar10) {
        case 0x7b:
          uVar24 = 0x4e;
          break;
        case 0x7c:
          uVar24 = 0x4f;
          break;
        case 0x7d:
        case 0x7e:
          uVar24 = 0x50;
LAB_00d03c2f:
          bVar9 = 2;
          local_81 = 2;
          if (*(long *)(op->args[1] + 0x28) == 1) {
            TVar16 = op->args[0];
            lVar12 = 0x30;
            uVar10 = uVar24;
            goto LAB_00d03c83;
          }
          goto LAB_00d03cd3;
        default:
          goto switchD_00d03c14_caseD_7f;
        case 0x81:
          goto switchD_00d03c14_caseD_81;
        }
LAB_00d03c6d:
        if (*(long *)(op->args[1] + 0x28) == 1) {
          TVar16 = op->args[0];
          lVar12 = 0x38;
          uVar10 = uVar24;
LAB_00d03c83:
          if (*(long *)(TVar16 + 0x28) == 1) {
LAB_00d03c8a:
            tcg_op_remove_tricore(s,op);
switchD_00d03c14_caseD_81:
            uVar23 = 0;
            goto LAB_00d03f92;
          }
          *(uint *)op = uVar18 & 0xffffff00 | uVar10;
          op->args[1] = op->args[2];
          op->args[2] = *(TCGArg *)((long)op->args + lVar12 + -0x18);
          local_81 = 2;
          bVar9 = 1;
        }
        else {
          local_81 = 4;
          bVar9 = 2;
        }
LAB_00d03cd3:
        local_54 = (uint)local_81;
LAB_00d03cde:
        uVar18 = (uint)bVar9;
        uVar17 = 0;
        uVar24 = 0;
        do {
          TVar16 = op->args[uVar17];
          pTVar4 = *(TCGRegSet **)(TVar16 + 0x30);
          op->output_pref[uVar17] = *pTVar4;
          uVar20 = 4 << ((byte)uVar17 & 0x1f);
          if ((*(ulong *)(TVar16 + 0x28) & 1) == 0) {
            uVar20 = 0;
          }
          uVar21 = 1 << ((byte)uVar17 & 0x1f);
          if ((*(ulong *)(TVar16 + 0x28) & 2) == 0) {
            uVar21 = 0;
          }
          uVar24 = uVar24 | uVar21 | uVar20;
          *(undefined8 *)(TVar16 + 0x28) = 1;
          *pTVar4 = 0;
          uVar17 = uVar17 + 1;
        } while (bVar9 != uVar17);
        uVar17 = (ulong)bVar9;
LAB_00d03d36:
        bVar9 = (&pTVar3->flags)[uVar22];
        if ((bVar9 & 1) == 0) {
          if ((bVar9 & 2) == 0) {
            if (((bVar9 & 8) != 0) && (la_global_sync(s,ng), ((&pTVar3->flags)[uVar22] & 4) != 0)) {
              la_cross_call(s,nt);
            }
          }
          else if (uVar10 == 0x26) {
            if (0 < (int)ng) {
              lVar12 = 0;
              do {
                pbVar1 = (byte *)((long)&s->temps[0].state + lVar12);
                *pbVar1 = *pbVar1 | 2;
                lVar12 = lVar12 + 0x38;
              } while (lVar15 != lVar12);
            }
          }
          else {
            if (0 < (int)ng) {
              lVar12 = 0;
              do {
                *(undefined8 *)((long)&s->temps[0].state + lVar12) = 3;
                **(TCGRegSet **)((long)&s->temps[0].state_ptr + lVar12) =
                     s->tcg_target_available_regs[(byte)(&s->temps[0].field_0x3)[lVar12]];
                lVar12 = lVar12 + 0x38;
              } while (lVar15 != lVar12);
            }
            ppvVar13 = &s->temps[(int)ng].state_ptr;
            lVar12 = (long)(int)nt - (long)(int)ng;
            if ((int)ng < (int)nt) {
              do {
                uVar14 = *(ulong *)(ppvVar13 + -6) & 0x4000000000;
                TVar19 = 0;
                ppvVar13[-1] = (void *)((uVar14 >> 0x26) * 2 + 1);
                if (uVar14 != 0) {
                  TVar19 = s->tcg_target_available_regs[*(ulong *)(ppvVar13 + -6) >> 0x18 & 0xff];
                }
                *(TCGRegSet *)*ppvVar13 = TVar19;
                ppvVar13 = ppvVar13 + 7;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
          }
        }
        else {
          la_func_end(s,ng,nt);
        }
        uVar18 = uVar18 + local_54;
        if (local_81 != 0) {
          uVar14 = uVar17;
          do {
            uVar20 = 0;
            if ((*(byte *)(op->args[uVar14] + 0x28) & 1) != 0) {
              uVar20 = 4 << ((byte)uVar14 & 0x1f);
            }
            uVar24 = uVar24 | uVar20;
            uVar14 = uVar14 + 1;
          } while (uVar14 < uVar18);
          uVar14 = uVar17;
          if (local_81 != 0) {
            do {
              TVar16 = op->args[uVar14];
              uVar5 = *(ulong *)(TVar16 + 0x28);
              if ((uVar5 & 1) != 0) {
                **(TCGRegSet **)(TVar16 + 0x30) =
                     s->tcg_target_available_regs[*(byte *)(TVar16 + 3)];
                *(ulong *)(TVar16 + 0x28) = uVar5 & 0xfffffffffffffffe;
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 < uVar18);
          }
        }
        uVar23 = (undefined2)uVar24;
        if ((uVar10 == 5) || (uVar10 == 0x3f)) {
          if ((uVar24 & 8) != 0) {
            **(undefined4 **)(op->args[0] + 0x30) = **(undefined4 **)(op->args[1] + 0x30);
          }
        }
        else if (local_81 != 0) {
          lVar12 = *(long *)((long)&pTVar3->args_ct + (ulong)uVar22);
          do {
            puVar6 = *(uint **)(op->args[uVar17] + 0x30);
            uVar10 = *(uint *)(lVar12 + 4 + uVar17 * 8);
            uVar22 = *puVar6 & uVar10;
            if ((*(byte *)(lVar12 + uVar17 * 8) & 0x40) != 0) {
              uVar22 = uVar22 & op->output_pref[*(byte *)(lVar12 + 2 + uVar17 * 8)];
            }
            if (uVar22 != 0) {
              uVar10 = uVar22;
            }
            *puVar6 = uVar10;
            uVar17 = uVar17 + 1;
          } while (uVar17 < uVar18);
        }
      }
LAB_00d03f92:
      *(undefined2 *)&op->field_0x2 = uVar23;
      op = pTVar2;
    } while (pTVar2 != (TCGOp *)0x0);
  }
  return;
}

Assistant:

static void liveness_pass_1(TCGContext *s)
{
    int nb_globals = s->nb_globals;
    int nb_temps = s->nb_temps;
    TCGOp *op, *op_prev;
    TCGRegSet *prefs;
    int i;

    prefs = tcg_malloc(s, sizeof(TCGRegSet) * nb_temps);
    for (i = 0; i < nb_temps; ++i) {
        s->temps[i].state_ptr = prefs + i;
    }

    /* ??? Should be redundant with the exit_tb that ends the TB.  */
    la_func_end(s, nb_globals, nb_temps);

    QTAILQ_FOREACH_REVERSE_SAFE(op, &s->ops, link, op_prev) {
        int nb_iargs, nb_oargs;
        TCGOpcode opc_new, opc_new2;
        bool have_opc_new2;
        TCGLifeData arg_life = 0;
        TCGTemp *ts;
        TCGOpcode opc = op->opc;
        const TCGOpDef *def = &s->tcg_op_defs[opc];

        switch (opc) {
        case INDEX_op_call:
            {
                int call_flags;
                int nb_call_regs;

                nb_oargs = TCGOP_CALLO(op);
                nb_iargs = TCGOP_CALLI(op);
                call_flags = op->args[nb_oargs + nb_iargs + 1];

                /* pure functions can be removed if their result is unused */
                if (call_flags & TCG_CALL_NO_SIDE_EFFECTS) {
                    for (i = 0; i < nb_oargs; i++) {
                        ts = arg_temp(op->args[i]);
                        if (ts->state != TS_DEAD) {
                            goto do_not_remove_call;
                        }
                    }
                    goto do_remove;
                }
            do_not_remove_call:

                /* Output args are dead.  */
                for (i = 0; i < nb_oargs; i++) {
                    ts = arg_temp(op->args[i]);
                    if (ts->state & TS_DEAD) {
                        arg_life |= DEAD_ARG << i;
                    }
                    if (ts->state & TS_MEM) {
                        arg_life |= SYNC_ARG << i;
                    }
                    ts->state = TS_DEAD;
                    la_reset_pref(s, ts);

                    /* Not used -- it will be tcg_target_call_oarg_regs[i].  */
                    op->output_pref[i] = 0;
                }

                if (!(call_flags & (TCG_CALL_NO_WRITE_GLOBALS |
                                    TCG_CALL_NO_READ_GLOBALS))) {
                    la_global_kill(s, nb_globals);
                } else if (!(call_flags & TCG_CALL_NO_READ_GLOBALS)) {
                    la_global_sync(s, nb_globals);
                }

                /* Record arguments that die in this helper.  */
                for (i = nb_oargs; i < nb_iargs + nb_oargs; i++) {
                    ts = arg_temp(op->args[i]);
                    if (ts && ts->state & TS_DEAD) {
                        arg_life |= DEAD_ARG << i;
                    }
                }

                /* For all live registers, remove call-clobbered prefs.  */
                la_cross_call(s, nb_temps);

                nb_call_regs = ARRAY_SIZE(tcg_target_call_iarg_regs);

                /* Input arguments are live for preceding opcodes.  */
                for (i = 0; i < nb_iargs; i++) {
                    ts = arg_temp(op->args[i + nb_oargs]);
                    if (ts && ts->state & TS_DEAD) {
                        /* For those arguments that die, and will be allocated
                         * in registers, clear the register set for that arg,
                         * to be filled in below.  For args that will be on
                         * the stack, reset to any available reg.
                         */
                        *la_temp_pref(ts)
                            = (i < nb_call_regs ? 0 :
                               s->tcg_target_available_regs[ts->type]);
                        ts->state &= ~TS_DEAD;
                    }
                }

                /* For each input argument, add its input register to prefs.
                   If a temp is used once, this produces a single set bit.  */
                for (i = 0; i < MIN(nb_call_regs, nb_iargs); i++) {
                    ts = arg_temp(op->args[i + nb_oargs]);
                    if (ts) {
                        tcg_regset_set_reg(*la_temp_pref(ts),
                                           tcg_target_call_iarg_regs[i]);
                    }
                }
            }
            break;
        case INDEX_op_insn_start:
            break;
        case INDEX_op_discard:
            /* mark the temporary as dead */
            ts = arg_temp(op->args[0]);
            ts->state = TS_DEAD;
            la_reset_pref(s, ts);
            break;

        case INDEX_op_add2_i32:
            opc_new = INDEX_op_add_i32;
            goto do_addsub2;
        case INDEX_op_sub2_i32:
            opc_new = INDEX_op_sub_i32;
            goto do_addsub2;
        case INDEX_op_add2_i64:
            opc_new = INDEX_op_add_i64;
            goto do_addsub2;
        case INDEX_op_sub2_i64:
            opc_new = INDEX_op_sub_i64;
        do_addsub2:
            nb_iargs = 4;
            nb_oargs = 2;
            /* Test if the high part of the operation is dead, but not
               the low part.  The result can be optimized to a simple
               add or sub.  This happens often for x86_64 guest when the
               cpu mode is set to 32 bit.  */
            if (arg_temp(op->args[1])->state == TS_DEAD) {
                if (arg_temp(op->args[0])->state == TS_DEAD) {
                    goto do_remove;
                }
                /* Replace the opcode and adjust the args in place,
                   leaving 3 unused args at the end.  */
                op->opc = opc = opc_new;
                op->args[1] = op->args[2];
                op->args[2] = op->args[4];
                /* Fall through and mark the single-word operation live.  */
                nb_iargs = 2;
                nb_oargs = 1;
            }
            goto do_not_remove;

        case INDEX_op_mulu2_i32:
            opc_new = INDEX_op_mul_i32;
            opc_new2 = INDEX_op_muluh_i32;
            have_opc_new2 = TCG_TARGET_HAS_muluh_i32;
            goto do_mul2;
        case INDEX_op_muls2_i32:
            opc_new = INDEX_op_mul_i32;
            opc_new2 = INDEX_op_mulsh_i32;
            have_opc_new2 = TCG_TARGET_HAS_mulsh_i32;
            goto do_mul2;
        case INDEX_op_mulu2_i64:
            opc_new = INDEX_op_mul_i64;
            opc_new2 = INDEX_op_muluh_i64;
            have_opc_new2 = TCG_TARGET_HAS_muluh_i64;
            goto do_mul2;
        case INDEX_op_muls2_i64:
            opc_new = INDEX_op_mul_i64;
            opc_new2 = INDEX_op_mulsh_i64;
            have_opc_new2 = TCG_TARGET_HAS_mulsh_i64;
            goto do_mul2;
        do_mul2:
            nb_iargs = 2;
            nb_oargs = 2;
            if (arg_temp(op->args[1])->state == TS_DEAD) {
                if (arg_temp(op->args[0])->state == TS_DEAD) {
                    /* Both parts of the operation are dead.  */
                    goto do_remove;
                }
                /* The high part of the operation is dead; generate the low. */
                op->opc = opc = opc_new;
                op->args[1] = op->args[2];
                op->args[2] = op->args[3];
            } else if (arg_temp(op->args[0])->state == TS_DEAD && have_opc_new2) {
                /* The low part of the operation is dead; generate the high. */
                op->opc = opc = opc_new2;
                op->args[0] = op->args[1];
                op->args[1] = op->args[2];
                op->args[2] = op->args[3];
            } else {
                goto do_not_remove;
            }
            /* Mark the single-word operation live.  */
            nb_oargs = 1;
            goto do_not_remove;

        default:
            /* XXX: optimize by hardcoding common cases (e.g. triadic ops) */
            nb_iargs = def->nb_iargs;
            nb_oargs = def->nb_oargs;

            /* Test if the operation can be removed because all
               its outputs are dead. We assume that nb_oargs == 0
               implies side effects */
            if (!(def->flags & TCG_OPF_SIDE_EFFECTS) && nb_oargs != 0) {
                for (i = 0; i < nb_oargs; i++) {
                    if (arg_temp(op->args[i])->state != TS_DEAD) {
                        goto do_not_remove;
                    }
                }
                goto do_remove;
            }
            goto do_not_remove;

        do_remove:
            tcg_op_remove(s, op);
            break;

        do_not_remove:
            for (i = 0; i < nb_oargs; i++) {
                ts = arg_temp(op->args[i]);

                /* Remember the preference of the uses that followed.  */
                op->output_pref[i] = *la_temp_pref(ts);

                /* Output args are dead.  */
                if (ts->state & TS_DEAD) {
                    arg_life |= DEAD_ARG << i;
                }
                if (ts->state & TS_MEM) {
                    arg_life |= SYNC_ARG << i;
                }
                ts->state = TS_DEAD;
                la_reset_pref(s, ts);
            }

            /* If end of basic block, update.  */
            if (def->flags & TCG_OPF_BB_EXIT) {
                la_func_end(s, nb_globals, nb_temps);
            } else if (def->flags & TCG_OPF_BB_END) {
                // Unicorn: do not optimize dead temps on brcond,
                // this causes problem because check_exit_request() inserts
                // brcond instruction in the middle of the TB,
                // which incorrectly flags end-of-block
                if (opc != INDEX_op_brcond_i32) {
                    la_bb_end(s, nb_globals, nb_temps);
                } else {
                    // Unicorn: we do not touch dead temps for brcond,
                    // but we should refresh TCG globals In-Memory states,
                    // otherwise, important CPU states(especially conditional flags) might be forgotten,
                    // result in wrongly generated host code that run into wrong branch.
                    // Refer to https://github.com/unicorn-engine/unicorn/issues/287 for further information
                    la_brcond_end(s, nb_globals);
                }
            } else if (def->flags & TCG_OPF_SIDE_EFFECTS) {
                la_global_sync(s, nb_globals);
                if (def->flags & TCG_OPF_CALL_CLOBBER) {
                    la_cross_call(s, nb_temps);
                }
            }

            /* Record arguments that die in this opcode.  */
            for (i = nb_oargs; i < nb_oargs + nb_iargs; i++) {
                ts = arg_temp(op->args[i]);
                if (ts->state & TS_DEAD) {
                    arg_life |= DEAD_ARG << i;
                }
            }

            /* Input arguments are live for preceding opcodes.  */
            for (i = nb_oargs; i < nb_oargs + nb_iargs; i++) {
                ts = arg_temp(op->args[i]);
                if (ts->state & TS_DEAD) {
                    /* For operands that were dead, initially allow
                       all regs for the type.  */
                    *la_temp_pref(ts) = s->tcg_target_available_regs[ts->type];
                    ts->state &= ~TS_DEAD;
                }
            }

            /* Incorporate constraints for this operand.  */
            switch (opc) {
            case INDEX_op_mov_i32:
            case INDEX_op_mov_i64:
                /* Note that these are TCG_OPF_NOT_PRESENT and do not
                   have proper constraints.  That said, special case
                   moves to propagate preferences backward.  */
                if (IS_DEAD_ARG(1)) {
                    *la_temp_pref(arg_temp(op->args[0]))
                        = *la_temp_pref(arg_temp(op->args[1]));
                }
                break;

            default:
                for (i = nb_oargs; i < nb_oargs + nb_iargs; i++) {
                    const TCGArgConstraint *ct = &def->args_ct[i];
                    TCGRegSet set, *pset;

                    ts = arg_temp(op->args[i]);
                    pset = la_temp_pref(ts);
                    set = *pset;

                    set &= ct->u.regs;
                    if (ct->ct & TCG_CT_IALIAS) {
                        set &= op->output_pref[ct->alias_index];
                    }
                    /* If the combination is not possible, restart.  */
                    if (set == 0) {
                        set = ct->u.regs;
                    }
                    *pset = set;
                }
                break;
            }
            break;
        }
        op->life = arg_life;
    }
}